

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

void __thiscall MyCompiler::Token::Token(Token *this,SymbolType symbolType,string *value)

{
  string *value_local;
  SymbolType symbolType_local;
  Token *this_local;
  
  this->symbolType = symbolType;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

MyCompiler::Token::Token(MyCompiler::SymbolType symbolType, std::string value)
        : symbolType(symbolType), value(std::move(value))
{}